

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# todec.h
# Opt level: O0

void cppcms::impl::details::decimal_traits<true>::conv<int>(int v,char **begin,char **buf)

{
  char *pcVar1;
  char **in_RDX;
  char **in_RSI;
  int in_EDI;
  int local_4;
  
  if (in_EDI < 0) {
    pcVar1 = *in_RDX;
    *in_RDX = pcVar1 + 1;
    *pcVar1 = '-';
    *in_RSI = *in_RDX;
    for (local_4 = in_EDI; local_4 != 0; local_4 = local_4 / 10) {
      pcVar1 = *in_RDX;
      *in_RDX = pcVar1 + 1;
      *pcVar1 = '0' - (char)(local_4 % 10);
    }
  }
  else {
    decimal_traits<false>::conv<int>(in_EDI,in_RSI,in_RDX);
  }
  return;
}

Assistant:

static void conv(T v,char *&begin,char *&buf)
				{
					if(v<0) {
						*buf++ = '-';
						begin=buf;
						while(v!=0) {
							*buf++ = '0' - (v % 10);
							v/=10;
						}
					}
					else {
						decimal_traits<false>::conv(v,begin,buf);
					}
				}